

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void __thiscall QRegionPrivate::intersect(QRegionPrivate *this,QRect *rect)

{
  Representation RVar1;
  bool bVar2;
  int iVar3;
  int *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QRect *prev;
  QRect *nextToLast;
  int n;
  QRect *src;
  QRect *dest;
  QRect r;
  int in_stack_ffffffffffffff2c;
  pointer in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QRegionPrivate *in_stack_ffffffffffffff40;
  QRect *in_stack_ffffffffffffff48;
  QRect *bottom;
  QRect *top;
  int local_84;
  pointer local_78;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  QRect local_48;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = QRect::normalized();
  QRect::QRect(in_stack_ffffffffffffff30);
  *(undefined8 *)(in_RDI + 8) = local_28;
  *(undefined8 *)(in_RDI + 10) = local_20;
  QRect::QRect(in_stack_ffffffffffffff30);
  *(undefined8 *)(in_RDI + 0xc) = local_38;
  *(undefined8 *)(in_RDI + 0xe) = local_30;
  in_RDI[1] = -1;
  local_78 = QList<QRect>::data((QList<QRect> *)in_stack_ffffffffffffff30);
  local_84 = *in_RDI;
  *in_RDI = 0;
  do {
    while( true ) {
      do {
        iVar3 = local_84 + -1;
        if (local_84 == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
            __stack_chk_fail();
          }
          return;
        }
        QVar4 = qt_rect_intersect_normalized
                          (in_stack_ffffffffffffff48,(QRect *)in_stack_ffffffffffffff40);
        local_48._0_8_ = QVar4._0_8_;
        local_78->x1 = (Representation)local_48.x1.m_i;
        local_78->y1 = (Representation)local_48.y1.m_i;
        local_48._8_8_ = QVar4._8_8_;
        local_78->x2 = (Representation)local_48.x2.m_i;
        local_78->y2 = (Representation)local_48.y2.m_i;
        local_48 = QVar4;
        bVar2 = QRect::isEmpty(in_stack_ffffffffffffff30);
        local_84 = iVar3;
      } while (bVar2);
      if (*in_RDI != 0) break;
      RVar1.m_i = (local_78->y1).m_i;
      in_RDI[8] = (local_78->x1).m_i;
      in_RDI[9] = RVar1.m_i;
      RVar1.m_i = (local_78->y2).m_i;
      in_RDI[10] = (local_78->x2).m_i;
      in_RDI[0xb] = RVar1.m_i;
LAB_00652b7c:
      updateInnerRect(in_stack_ffffffffffffff40,
                      (QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_78 = local_78 + 1;
      *in_RDI = *in_RDI + 1;
    }
    in_stack_ffffffffffffff48 = (QRect *)(in_RDI + 8);
    local_4c = QRect::left((QRect *)0x6529c3);
    local_50 = QRect::left((QRect *)0x6529d4);
    qMin<int>(&local_4c,&local_50);
    QRect::setLeft(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    bottom = (QRect *)(in_RDI + 8);
    local_54 = QRect::right((QRect *)0x652a16);
    local_58 = QRect::right((QRect *)0x652a27);
    qMax<int>(&local_54,&local_58);
    QRect::setRight(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    top = (QRect *)(in_RDI + 8);
    local_5c = QRect::bottom((QRect *)0x652a69);
    local_60 = QRect::bottom((QRect *)0x652a77);
    qMax<int>(&local_5c,&local_60);
    QRect::setBottom(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    if (*in_RDI < 2) {
      in_stack_ffffffffffffff40 = (QRegionPrivate *)0x0;
    }
    else {
      in_stack_ffffffffffffff40 = (QRegionPrivate *)(local_78 + -2);
    }
    bVar2 = canMergeFromBelow(top,bottom,in_stack_ffffffffffffff48,
                              (QRect *)in_stack_ffffffffffffff40);
    if (!bVar2) goto LAB_00652b7c;
    if (iVar3 != 0) {
      in_stack_ffffffffffffff3c = QRect::y((QRect *)0x652af9);
      iVar3 = QRect::y((QRect *)0x652b07);
      if (in_stack_ffffffffffffff3c == iVar3) {
        in_stack_ffffffffffffff38 = QRect::left((QRect *)0x652b1b);
        iVar3 = QRect::right((QRect *)0x652b2c);
        if (in_stack_ffffffffffffff38 <= iVar3) goto LAB_00652b7c;
      }
    }
    in_stack_ffffffffffffff30 = local_78 + -1;
    QRect::bottom((QRect *)0x652b58);
    QRect::setBottom(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    updateInnerRect(in_stack_ffffffffffffff40,
                    (QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  } while( true );
}

Assistant:

void QRegionPrivate::intersect(const QRect &rect)
{
    Q_ASSERT(extents.intersects(rect));
    Q_ASSERT(numRects > 1);

#ifdef QT_REGION_DEBUG
    selfTest();
#endif

    const QRect r = rect.normalized();
    extents = QRect();
    innerRect = QRect();
    innerArea = -1;

    QRect *dest = rects.data();
    const QRect *src = dest;
    int n = numRects;
    numRects = 0;
    while (n--) {
        *dest = qt_rect_intersect_normalized(*src++, r);
        if (dest->isEmpty())
            continue;

        if (numRects == 0) {
            extents = *dest;
        } else {
            extents.setLeft(qMin(extents.left(), dest->left()));
            // hw: extents.top() will never change after initialization
            //extents.setTop(qMin(extents.top(), dest->top()));
            extents.setRight(qMax(extents.right(), dest->right()));
            extents.setBottom(qMax(extents.bottom(), dest->bottom()));

            const QRect *nextToLast = (numRects > 1 ? dest - 2 : nullptr);

            // mergeFromBelow inlined and optimized
            if (canMergeFromBelow(dest - 1, dest, nextToLast, nullptr)) {
                if (!n || src->y() != dest->y() || src->left() > r.right()) {
                    QRect *prev = dest - 1;
                    prev->setBottom(dest->bottom());
                    updateInnerRect(*prev);
                    continue;
                }
            }
        }
        updateInnerRect(*dest);
        ++dest;
        ++numRects;
    }
#ifdef QT_REGION_DEBUG
    selfTest();
#endif
}